

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O2

astcenc_error
astcenc_compress_image
          (astcenc_context *ctxo,astcenc_image *imagep,astcenc_swizzle *swizzle,uint8_t *data_out,
          size_t data_len,uint thread_index)

{
  atomic<unsigned_int> *paVar1;
  ParallelManager *this;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  astcenc_profile aVar10;
  block_size_descriptor *pbVar11;
  compression_working_buffers *pcVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  astcenc_error aVar17;
  uint uVar18;
  uint uVar19;
  EVP_PKEY_CTX *ctx;
  bool bVar20;
  uint uVar21;
  int iVar22;
  _Any_data *ctx_00;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int x;
  uint uVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint local_1138;
  uint local_1130;
  code *local_1128;
  _Any_data local_10c0;
  code *pcStack_10b0;
  code *pcStack_10a8;
  _Any_data local_10a0;
  code *local_1090;
  code *local_1088;
  undefined1 local_1080 [32];
  uint uStack_1060;
  uint uStack_105c;
  uint uStack_1058;
  uint uStack_1054;
  uint uStack_1050;
  uint uStack_104c;
  vfloat4 *local_1048;
  uint8_t local_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  vfloat4 local_240;
  bool local_230;
  bool local_22f;
  
  if (((ctxo->context).config.flags & 0x10) == 0) {
    auVar30._8_4_ = 6;
    auVar30._0_8_ = 0x600000006;
    auVar30._12_4_ = 6;
    auVar30 = vpmaxud_avx((undefined1  [16])*swizzle,auVar30);
    auVar30 = vpcmpeqd_avx((undefined1  [16])*swizzle,auVar30);
    if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar30[0xf]) {
      uVar8 = (ctxo->context).thread_count;
      if (thread_index < uVar8) {
        uVar9 = (ctxo->context).config.block_x;
        uVar23 = (ctxo->context).config.block_y;
        uVar25 = (ctxo->context).config.block_z;
        ctx_00 = (_Any_data *)
                 (ulong)((((uVar23 + imagep->dim_y) - 1) / uVar23) *
                         (((imagep->dim_x + uVar9) - 1) / uVar9) *
                         (((imagep->dim_z + uVar25) - 1) / uVar25) * 0x10);
        if (data_len < ctx_00) {
          aVar17 = ASTCENC_ERR_OUT_OF_MEM;
        }
        else {
          if (uVar8 == 1) {
            astcenc_compress_reset(ctxo);
          }
          if ((ctxo->context).config.a_scale_radius != 0) {
            local_10c0._M_unused._M_object = (void *)0x0;
            local_10c0._8_8_ = 0;
            pcStack_10b0 = (code *)0x0;
            pcStack_10a8 = (code *)0x0;
            local_10c0._M_unused._M_object = operator_new(0x18);
            *(astcenc_context **)local_10c0._M_unused._0_8_ = ctxo;
            *(astcenc_image **)((long)local_10c0._M_unused._0_8_ + 8) = imagep;
            *(astcenc_swizzle **)((long)local_10c0._M_unused._0_8_ + 0x10) = swizzle;
            ctx_00 = &local_10c0;
            pcStack_10a8 = std::
                           _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_entry.cpp:1069:19)>
                           ::_M_invoke;
            pcStack_10b0 = std::
                           _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_entry.cpp:1069:19)>
                           ::_M_manager;
            ParallelManager::init(&ctxo->manage_avg,(EVP_PKEY_CTX *)ctx_00->_M_pod_data);
            std::_Function_base::~_Function_base((_Function_base *)&local_10c0);
            local_1080._0_8_ = (ctxo->context).avg_preprocess_args.arg.img;
            local_1080._8_4_ = (ctxo->context).avg_preprocess_args.arg.swz.r;
            local_1080._12_4_ = (ctxo->context).avg_preprocess_args.arg.swz.g;
            local_1080._16_4_ = (ctxo->context).avg_preprocess_args.arg.swz.b;
            local_1080._20_4_ = (ctxo->context).avg_preprocess_args.arg.swz.a;
            local_1080[0x18] = (ctxo->context).avg_preprocess_args.arg.have_z;
            local_1080._25_3_ = *(undefined3 *)&(ctxo->context).avg_preprocess_args.arg.field_0x19;
            local_1080._28_4_ = (ctxo->context).avg_preprocess_args.arg.alpha_kernel_radius;
            uStack_1060 = (ctxo->context).avg_preprocess_args.arg.size_x;
            uStack_105c = (ctxo->context).avg_preprocess_args.arg.size_y;
            uStack_1058 = (ctxo->context).avg_preprocess_args.arg.size_z;
            uStack_1054 = (ctxo->context).avg_preprocess_args.arg.offset_x;
            uStack_1050 = (ctxo->context).avg_preprocess_args.arg.offset_y;
            uStack_104c = (ctxo->context).avg_preprocess_args.arg.offset_z;
            local_1048 = (vfloat4 *)
                         operator_new__((ulong)(ctxo->context).avg_preprocess_args.work_memory_size
                                        << 4);
            uVar8 = (ctxo->context).avg_preprocess_args.img_size_x;
            uVar9 = (ctxo->context).avg_preprocess_args.img_size_y;
            uVar23 = (ctxo->context).avg_preprocess_args.img_size_z;
            uVar25 = (ctxo->context).avg_preprocess_args.blk_size_xy;
            uVar26 = (ctxo->context).avg_preprocess_args.blk_size_z;
            uVar14 = (int)(uVar9 + uVar25 + -1) / (int)uVar25;
            while( true ) {
              LOCK();
              paVar1 = &(ctxo->manage_avg).m_start_count;
              uVar18 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
              (paVar1->super___atomic_base<unsigned_int>)._M_i =
                   (paVar1->super___atomic_base<unsigned_int>)._M_i + 0x10;
              UNLOCK();
              if ((((ctxo->manage_avg).m_is_cancelled._M_base._M_i & 1U) != 0) ||
                 (uVar15 = (ctxo->manage_avg).m_task_count, uVar21 = uVar15 - uVar18,
                 uVar15 < uVar18 || uVar21 == 0)) break;
              ctx_00 = (_Any_data *)(ulong)uVar21;
              if (0xf < uVar21) {
                ctx_00 = (_Any_data *)0x10;
              }
              uVar15 = (uint)ctx_00 + uVar18;
              for (; uVar18 < uVar15; uVar18 = uVar18 + 1) {
                uVar28 = 0;
                uStack_104c = (uVar18 / uVar14) * uVar26;
                uStack_1050 = (uVar18 - uStack_104c * uVar14) * uVar25;
                uVar21 = uVar23 - uStack_104c;
                if ((int)uVar26 < (int)uVar21) {
                  uVar21 = uVar26;
                }
                uStack_1058 = uVar21;
                uVar21 = uVar9 - uStack_1050;
                if ((int)uVar25 < (int)uVar21) {
                  uVar21 = uVar25;
                }
                uStack_105c = uVar21;
                uVar21 = uVar8;
                for (; (int)uVar28 < (int)uVar8; uVar28 = uVar28 + uVar25) {
                  uVar19 = uVar21;
                  if ((int)uVar25 < (int)uVar21) {
                    uVar19 = uVar25;
                  }
                  uVar21 = -(uVar25 - uVar21);
                  uStack_1060 = uVar19;
                  uStack_1054 = uVar28;
                  compute_pixel_region_variance(&ctxo->context,(pixel_region_args *)local_1080);
                }
              }
              ParallelManager::complete_task_assignment(&ctxo->manage_avg,(uint)ctx_00);
            }
            if (local_1048 != (vfloat4 *)0x0) {
              operator_delete__(local_1048);
            }
          }
          ParallelManager::wait(&ctxo->manage_avg,ctx_00);
          pbVar11 = (ctxo->context).bsd;
          aVar10 = (ctxo->context).config.profile;
          bVar5 = pbVar11->xdim;
          bVar6 = pbVar11->ydim;
          bVar7 = pbVar11->zdim;
          local_284 = bVar6 * bVar5 * bVar7;
          uVar8 = imagep->dim_x;
          uVar9 = imagep->dim_y;
          uVar23 = (int)(bVar5 + uVar8 + -1) / (int)(uint)bVar5;
          iVar24 = (int)(bVar6 + uVar9 + -1) / (int)(uint)bVar6;
          uVar25 = iVar24 * uVar23;
          local_22f = (bool)((byte)(ctxo->context).config.flags >> 1 & 1);
          local_240.m[0] = (ctxo->context).config.cw_r_weight;
          local_240.m[1] = (ctxo->context).config.cw_g_weight;
          local_240.m[2] = (ctxo->context).config.cw_b_weight;
          local_240.m[3] = (ctxo->context).config.cw_a_weight;
          pcVar12 = (ctxo->context).working_buffers;
          this = &ctxo->manage_compress;
          ctx = (EVP_PKEY_CTX *)
                (ulong)(((int)((uint)bVar7 + imagep->dim_z + -1) / (int)(uint)bVar7) * uVar25);
          ParallelManager::init(this,ctx);
          local_1128 = load_image_block;
          if (((*swizzle == _DAT_002f8df0) &&
              ((aVar10 & ~ASTCENC_PRF_LDR) != ASTCENC_PRF_HDR_RGB_LDR_A)) && (bVar7 == 1)) {
            if (imagep->data_type == ASTCENC_TYPE_U8) {
              local_1128 = load_image_block_fast_ldr;
            }
            else {
              local_1128 = load_image_block;
            }
          }
          while( true ) {
            LOCK();
            paVar1 = &(ctxo->manage_compress).m_start_count;
            uVar26 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
            (paVar1->super___atomic_base<unsigned_int>)._M_i =
                 (paVar1->super___atomic_base<unsigned_int>)._M_i + 0x10;
            UNLOCK();
            if ((((ctxo->manage_compress).m_is_cancelled._M_base._M_i & 1U) != 0) ||
               (uVar14 = (ctxo->manage_compress).m_task_count, uVar18 = uVar14 - uVar26,
               uVar14 < uVar26 || uVar18 == 0)) break;
            ctx = (EVP_PKEY_CTX *)(ulong)uVar18;
            if (0xf < uVar18) {
              ctx = (EVP_PKEY_CTX *)0x10;
            }
            uVar14 = (uint)ctx + uVar26;
            for (; uVar26 < uVar14; uVar26 = uVar26 + 1) {
              uVar18 = (ctxo->context).config.a_scale_radius;
              iVar22 = (int)(((ulong)uVar26 % (ulong)uVar25) % (ulong)uVar23);
              uVar15 = (uint)bVar5;
              uVar21 = iVar22 * uVar15;
              iVar16 = (int)(((ulong)uVar26 % (ulong)uVar25) / (ulong)uVar23);
              local_1130 = (uint)bVar6;
              if (bVar7 == 1 && uVar18 != 0) {
                uVar28 = uVar21 + uVar15;
                if ((int)uVar8 < (int)(uVar21 + uVar15)) {
                  uVar28 = uVar8;
                }
                uVar27 = iVar16 * local_1130;
                uVar19 = uVar27 + local_1130;
                if ((int)uVar9 < (int)(uVar27 + local_1130)) {
                  uVar19 = uVar9;
                }
                fVar29 = 0.9 / ((float)(int)((local_1130 + uVar18 * 2 + -2) *
                                            (uVar15 + uVar18 * 2 + -2)) * 255.0);
                bVar20 = false;
                for (; uVar18 = uVar21, (int)uVar27 < (int)uVar19; uVar27 = uVar27 + 1) {
                  while ((int)uVar18 < (int)uVar28) {
                    fVar2 = (ctxo->context).input_alpha_averages[(int)(uVar27 * uVar8 + uVar18)];
                    uVar15 = uVar28;
                    uVar13 = uVar19;
                    if (fVar2 <= fVar29) {
                      uVar15 = uVar18;
                      uVar13 = uVar27;
                    }
                    uVar27 = uVar13;
                    bVar20 = (bool)(bVar20 | fVar29 < fVar2);
                    uVar18 = uVar15 + 1;
                  }
                }
                if (bVar20) goto LAB_0024de97;
                local_280 = ZEXT1632(ZEXT816(0));
                local_230 = true;
                local_260 = local_280;
              }
              else {
LAB_0024de97:
                local_1138 = (uint)bVar7;
                (*local_1128)(aVar10,imagep,local_1080,pbVar11,uVar21,iVar16 * local_1130,
                              (uVar26 / uVar25) * local_1138,swizzle);
                if (((ctxo->context).config.flags & 4) != 0) {
                  fVar29 = (float)local_260._28_4_ * 1.5259022e-05;
                  uVar3 = (ctxo->context).config.cw_g_weight;
                  uVar4 = (ctxo->context).config.cw_b_weight;
                  auVar31._0_4_ = fVar29 * (float)uVar3;
                  auVar31._4_4_ = fVar29 * (float)uVar4;
                  auVar31._8_4_ = fVar29 * 0.0;
                  auVar31._12_4_ = fVar29 * 0.0;
                  auVar30 = vmovlhps_avx(ZEXT416((uint)(fVar29 * (ctxo->context).config.cw_r_weight)
                                                ),auVar31);
                  auVar30 = vshufps_avx(auVar30,auVar31,0xd8);
                  local_240.m = (__m128)vinsertps_avx(auVar30,ZEXT416((uint)(ctxo->context).config.
                                                                            cw_a_weight),0x30);
                }
              }
              compress_block(&ctxo->context,(image_block *)local_1080,
                             data_out +
                             (int)((((uVar26 / uVar25) * iVar24 + iVar16) * uVar23 + iVar22) * 0x10)
                             ,pcVar12 + thread_index);
            }
            ParallelManager::complete_task_assignment(this,(uint)ctx);
          }
          ParallelManager::wait(this,ctx);
          local_10a0._8_8_ = 0;
          local_1088 = std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_entry.cpp:1094:23)>
                       ::_M_invoke;
          local_1090 = std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_entry.cpp:1094:23)>
                       ::_M_manager;
          local_10a0._M_unused._M_object = ctxo;
          ParallelManager::term(this,(function<void_()> *)&local_10a0);
          std::_Function_base::~_Function_base((_Function_base *)&local_10a0);
          aVar17 = ASTCENC_SUCCESS;
        }
      }
      else {
        aVar17 = ASTCENC_ERR_BAD_PARAM;
      }
    }
    else {
      aVar17 = ASTCENC_ERR_BAD_SWIZZLE;
    }
  }
  else {
    aVar17 = ASTCENC_ERR_BAD_CONTEXT;
  }
  return aVar17;
}

Assistant:

astcenc_error astcenc_compress_image(
	astcenc_context* ctxo,
	astcenc_image* imagep,
	const astcenc_swizzle* swizzle,
	uint8_t* data_out,
	size_t data_len,
	unsigned int thread_index
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	(void)imagep;
	(void)swizzle;
	(void)data_out;
	(void)data_len;
	(void)thread_index;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;
	astcenc_error status;
	astcenc_image& image = *imagep;

	if (ctx->config.flags & ASTCENC_FLG_DECOMPRESS_ONLY)
	{
		return ASTCENC_ERR_BAD_CONTEXT;
	}

	status = validate_compression_swizzle(*swizzle);
	if (status != ASTCENC_SUCCESS)
	{
		return status;
	}

	if (thread_index >= ctx->thread_count)
	{
		return ASTCENC_ERR_BAD_PARAM;
	}

	unsigned int block_x = ctx->config.block_x;
	unsigned int block_y = ctx->config.block_y;
	unsigned int block_z = ctx->config.block_z;

	unsigned int xblocks = (image.dim_x + block_x - 1) / block_x;
	unsigned int yblocks = (image.dim_y + block_y - 1) / block_y;
	unsigned int zblocks = (image.dim_z + block_z - 1) / block_z;

	// Check we have enough output space (16 bytes per block)
	size_t size_needed = xblocks * yblocks * zblocks * 16;
	if (data_len < size_needed)
	{
		return ASTCENC_ERR_OUT_OF_MEM;
	}

	// If context thread count is one then implicitly reset
	if (ctx->thread_count == 1)
	{
		astcenc_compress_reset(ctxo);
	}

	if (ctx->config.a_scale_radius != 0)
	{
		// First thread to enter will do setup, other threads will subsequently
		// enter the critical section but simply skip over the initialization
		auto init_avg = [ctx, &image, swizzle]() {
			// Perform memory allocations for the destination buffers
			size_t texel_count = image.dim_x * image.dim_y * image.dim_z;
			ctx->input_alpha_averages = new float[texel_count];

			return init_compute_averages(
				image, ctx->config.a_scale_radius, *swizzle,
				ctx->avg_preprocess_args);
		};

		// Only the first thread actually runs the initializer
		ctxo->manage_avg.init(init_avg);

		// All threads will enter this function and dynamically grab work
		compute_averages(*ctxo, ctx->avg_preprocess_args);
	}

	// Wait for compute_averages to complete before compressing
	ctxo->manage_avg.wait();

	compress_image(*ctxo, thread_index, image, *swizzle, data_out);

	// Wait for compress to complete before freeing memory
	ctxo->manage_compress.wait();

	auto term_compress = [ctx]() {
		delete[] ctx->input_alpha_averages;
		ctx->input_alpha_averages = nullptr;
	};

	// Only the first thread to arrive actually runs the term
	ctxo->manage_compress.term(term_compress);

	return ASTCENC_SUCCESS;
#endif
}